

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_delete_dictionary(ion_dictionary_t *dictionary,ion_dictionary_id_t id)

{
  ion_dictionary_id_t id_00;
  ion_err_t iVar1;
  undefined1 local_78 [8];
  ion_dictionary_handler_t handler;
  ion_err_t local_1d;
  ion_dictionary_type_t type;
  ion_err_t err;
  ion_dictionary_id_t id_local;
  ion_dictionary_t *dictionary_local;
  
  if (dictionary->status == '\x01') {
    handler.close_dictionary._4_4_ = ion_get_dictionary_type(id);
    if (handler.close_dictionary._4_4_ == dictionary_type_error_t) {
      return '\x04';
    }
    ion_switch_handler(handler.close_dictionary._4_4_,(ion_dictionary_handler_t *)local_78);
    iVar1 = dictionary_destroy_dictionary((ion_dictionary_handler_t *)local_78,id);
    if (iVar1 != '\0') {
      return iVar1;
    }
    local_1d = ion_delete_from_master_table(id);
  }
  else {
    id_00 = dictionary->instance->id;
    iVar1 = dictionary_delete_dictionary(dictionary);
    if (iVar1 != '\0') {
      return '\x04';
    }
    local_1d = ion_delete_from_master_table(id_00);
  }
  return local_1d;
}

Assistant:

ion_err_t
ion_delete_dictionary(
	ion_dictionary_t	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t				err;
	ion_dictionary_type_t	type;

	if (ion_dictionary_status_closed != dictionary->status) {
		id	= dictionary->instance->id;
		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err_dictionary_destruction_error;
		}

		err = ion_delete_from_master_table(id);
	}
	else {
		type = ion_get_dictionary_type(id);

		if (dictionary_type_error_t == type) {
			return err_dictionary_destruction_error;
		}

		ion_dictionary_handler_t handler;

		ion_switch_handler(type, &handler);

		err = dictionary_destroy_dictionary(&handler, id);

		if (err_ok != err) {
			return err;
		}

		err = ion_delete_from_master_table(id);
	}

	return err;
}